

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct_column_reader.cpp
# Opt level: O3

idx_t __thiscall duckdb::StructColumnReader::GroupRowsAvailable(StructColumnReader *this)

{
  bool bVar1;
  int iVar2;
  reference pvVar3;
  pointer pCVar4;
  undefined4 extraout_var;
  size_type __n;
  
  if ((this->child_readers).
      super_vector<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->child_readers).
      super_vector<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    __n = 0;
    do {
      pvVar3 = vector<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>,_true>
               ::operator[](&this->child_readers,__n);
      pCVar4 = unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>::
               operator->(pvVar3);
      bVar1 = TypeHasExactRowCount(&pCVar4->column_schema->type);
      if (bVar1) goto LAB_01cb45ed;
      __n = __n + 1;
    } while (__n < (ulong)((long)(this->child_readers).
                                 super_vector<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>_>_>
                                 .
                                 super__Vector_base<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->child_readers).
                                 super_vector<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>_>_>
                                 .
                                 super__Vector_base<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  __n = 0;
LAB_01cb45ed:
  pvVar3 = vector<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>,_true>
           ::operator[](&this->child_readers,__n);
  pCVar4 = unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>::
           operator->(pvVar3);
  iVar2 = (*pCVar4->_vptr_ColumnReader[9])(pCVar4);
  return CONCAT44(extraout_var,iVar2);
}

Assistant:

idx_t StructColumnReader::GroupRowsAvailable() {
	for (idx_t i = 0; i < child_readers.size(); i++) {
		if (TypeHasExactRowCount(child_readers[i]->Type())) {
			return child_readers[i]->GroupRowsAvailable();
		}
	}
	return child_readers[0]->GroupRowsAvailable();
}